

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void opj_image_destroy(opj_image_t *image)

{
  void *ptr;
  uint uVar1;
  opj_image_comp_t *ptr_00;
  long lVar2;
  ulong uVar3;
  
  if (image != (opj_image_t *)0x0) {
    ptr_00 = image->comps;
    if (ptr_00 != (opj_image_comp_t *)0x0) {
      uVar1 = image->numcomps;
      if (uVar1 != 0) {
        lVar2 = 0x30;
        uVar3 = 0;
        do {
          ptr = *(void **)((long)&image->comps->dx + lVar2);
          if (ptr != (void *)0x0) {
            opj_image_data_free(ptr);
            uVar1 = image->numcomps;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x40;
        } while (uVar3 < uVar1);
        ptr_00 = image->comps;
      }
      opj_free(ptr_00);
    }
    if (image->icc_profile_buf != (OPJ_BYTE *)0x0) {
      opj_free(image->icc_profile_buf);
    }
    opj_free(image);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_image_destroy(opj_image_t *image)
{
    if (image) {
        if (image->comps) {
            OPJ_UINT32 compno;

            /* image components */
            for (compno = 0; compno < image->numcomps; compno++) {
                opj_image_comp_t *image_comp = &(image->comps[compno]);
                if (image_comp->data) {
                    opj_image_data_free(image_comp->data);
                }
            }
            opj_free(image->comps);
        }

        if (image->icc_profile_buf) {
            opj_free(image->icc_profile_buf);
        }

        opj_free(image);
    }
}